

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.hh
# Opt level: O0

void __thiscall
dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)0>::
~property_type_checker(property_type_checker<(dtc::fdt::property_value::value_type)0> *this)

{
  property_type_checker<(dtc::fdt::property_value::value_type)0> *this_local;
  
  property_checker::~property_checker(&this->super_property_checker);
  return;
}

Assistant:

property_type_checker(const char* name, const std::string &property_name) :
		property_checker(name, property_name) {}